

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

int run_run_container_andnot(run_container_t *src_1,run_container_t *src_2,container_t **dst)

{
  undefined8 in_RAX;
  run_container_t *dst_00;
  run_container_t *prVar1;
  uint8_t typecode_after;
  byte local_21;
  
  local_21 = (byte)((ulong)in_RAX >> 0x38);
  dst_00 = (run_container_t *)malloc(0x10);
  if (dst_00 == (run_container_t *)0x0) {
    dst_00 = (run_container_t *)0x0;
  }
  else {
    dst_00->n_runs = 0;
    dst_00->capacity = 0;
    dst_00->runs = (rle16_t *)0x0;
  }
  run_container_andnot(src_1,src_2,dst_00);
  prVar1 = (run_container_t *)convert_run_to_efficient_container(dst_00,&local_21);
  if (prVar1 != dst_00) {
    run_container_free(dst_00);
  }
  *dst = prVar1;
  return (int)local_21;
}

Assistant:

int run_run_container_andnot(
    const run_container_t *src_1, const run_container_t *src_2,
    container_t **dst
){
    run_container_t *ans = run_container_create();
    run_container_andnot(src_1, src_2, ans);
    uint8_t typecode_after;
    *dst = convert_run_to_efficient_container_and_free(ans, &typecode_after);
    return typecode_after;
}